

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O1

void __thiscall OPLmusicBlock::OPLmusicBlock(OPLmusicBlock *this)

{
  SDL_mutex *pSVar1;
  OPLio *pOVar2;
  int iVar3;
  
  musicBlock::musicBlock(&this->super_musicBlock);
  this->_vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicBlock_006f3b68;
  pSVar1 = (SDL_mutex *)SDL_CreateMutex();
  (this->ChipAccess).CritSec = pSVar1;
  if (pSVar1 == (SDL_mutex *)0x0) {
    I_FatalError("Failed to create a critical section mutex.");
  }
  (this->super_musicBlock).scoredata = (BYTE *)0x0;
  this->NextTickIn = 0.0;
  this->LastOffset = 0.0;
  iVar3 = 2;
  if (opl_numchips.Value < 2) {
    iVar3 = opl_numchips.Value;
  }
  this->NumChips = iVar3;
  this->Looping = false;
  this->FullPan = false;
  (this->super_musicBlock).io = (OPLio *)0x0;
  pOVar2 = (OPLio *)operator_new(0x58);
  pOVar2->_vptr_OPLio = (_func_int **)&PTR__OPLio_006f3128;
  (this->super_musicBlock).io = pOVar2;
  return;
}

Assistant:

OPLmusicBlock::OPLmusicBlock()
{
	scoredata = NULL;
	NextTickIn = 0;
	LastOffset = 0;
	NumChips = MIN(*opl_numchips, 2);
	Looping = false;
	FullPan = false;
	io = NULL;
	io = new OPLio;
}